

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

Environment * __thiscall testing::UnitTest::AddEnvironment(UnitTest *this,Environment *env)

{
  Environment *in_RSI;
  vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *in_RDI;
  Environment *local_8;
  
  if (in_RSI == (Environment *)0x0) {
    local_8 = (Environment *)0x0;
  }
  else {
    internal::UnitTestImpl::environments
              ((UnitTestImpl *)
               in_RDI[2].
               super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::push_back
              (in_RDI,(value_type *)in_RSI);
    local_8 = in_RSI;
  }
  return local_8;
}

Assistant:

Environment* UnitTest::AddEnvironment(Environment* env) {
  if (env == nullptr) {
    return nullptr;
  }

  impl_->environments().push_back(env);
  return env;
}